

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O3

_Bool XCore_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  cs_detail *__s;
  long lVar2;
  uint8_t *puVar3;
  DecodeStatus DVar4;
  uint8_t *orig_p;
  ulong uVar5;
  MCRegisterClass *pMVar6;
  byte bVar7;
  void *pvVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  byte *pbVar12;
  uint8_t *puVar13;
  uint uVar14;
  uint uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  ushort uVar18;
  uint uVar19;
  
  if (code_len < 2) {
    return false;
  }
  uVar18 = *(ushort *)code;
  uVar19 = (uint)uVar18;
  __s = MI->flat_insn->detail;
  if (__s != (cs_detail *)0x0) {
    memset(__s,0,0x5f8);
  }
  uVar11 = 0;
  puVar3 = DecoderTable16;
  do {
    puVar13 = puVar3;
    switch(*puVar13) {
    case '\x01':
      uVar11 = ~(-1 << (puVar13[2] & 0x1f)) << (puVar13[1] & 0x1f);
      if (puVar13[2] == 0x10) {
        uVar11 = 0xffff;
      }
      uVar11 = (uVar11 & uVar19) >> (puVar13[1] & 0x1f);
      puVar3 = puVar13 + 3;
      break;
    case '\x02':
      uVar5 = 0;
      uVar14 = 0;
      bVar7 = 0;
      do {
        lVar2 = uVar5 + 1;
        uVar14 = uVar14 + ((puVar13[lVar2] & 0x7f) << (bVar7 & 0x1f));
        bVar7 = bVar7 + 7;
        uVar5 = uVar5 + 1;
      } while ((char)puVar13[lVar2] < '\0');
      puVar3 = puVar13 + (uVar5 & 0xffffffff) + 3;
      if ((uVar14 & 0xffff) != uVar11) {
        puVar3 = puVar13 + (uVar5 & 0xffffffff) + 3 +
                 *(ushort *)(puVar13 + (uVar5 & 0xffffffff) + 1);
      }
      break;
    case '\x03':
      uVar14 = ~(-1 << (puVar13[2] & 0x1f)) << (puVar13[1] & 0x1f);
      if (puVar13[2] == 0x10) {
        uVar14 = 0xffff;
      }
      uVar5 = 0;
      uVar15 = 0;
      bVar7 = 0;
      do {
        lVar2 = uVar5 + 3;
        uVar15 = uVar15 + ((puVar13[lVar2] & 0x7f) << (bVar7 & 0x1f));
        bVar7 = bVar7 + 7;
        uVar5 = uVar5 + 1;
      } while ((char)puVar13[lVar2] < '\0');
      puVar3 = puVar13 + (uVar5 & 0xffffffff) + 5;
      if ((uVar14 & uVar19) >> (puVar13[1] & 0x1f) != uVar15) {
        puVar3 = puVar13 + (uVar5 & 0xffffffff) + 5 +
                 *(ushort *)(puVar13 + (uVar5 & 0xffffffff) + 3);
      }
      break;
    case '\x04':
      uVar5 = 0;
      do {
        lVar2 = uVar5 + 1;
        uVar5 = uVar5 + 1;
      } while ((char)puVar13[lVar2] < '\0');
      puVar3 = puVar13 + (uVar5 & 0xffffffff) + 3;
      break;
    case '\x05':
      goto switchD_001bed09_caseD_5;
    case '\x06':
      uVar5 = 0;
      do {
        lVar2 = uVar5 + 1;
        uVar5 = uVar5 + 1;
      } while ((char)puVar13[lVar2] < '\0');
      uVar9 = 0;
      do {
        lVar2 = uVar9 + (uVar5 & 0xffffffff) + 1;
        uVar9 = uVar9 + 1;
      } while ((char)puVar13[lVar2] < '\0');
      puVar3 = puVar13 + (uVar9 & 0xffffffff) + (uVar5 & 0xffffffff) + 1;
      break;
    default:
      goto switchD_001bed09_default;
    }
  } while( true );
switchD_001bed09_caseD_5:
  uVar5 = 0;
  uVar11 = 0;
  bVar7 = 0;
  do {
    lVar2 = uVar5 + 1;
    uVar11 = uVar11 + ((puVar13[lVar2] & 0x7f) << (bVar7 & 0x1f));
    bVar7 = bVar7 + 7;
    uVar5 = uVar5 + 1;
  } while ((char)puVar13[lVar2] < '\0');
  pbVar12 = puVar13 + (uVar5 & 0xffffffff) + 1;
  iVar10 = 0;
  bVar7 = 0;
  do {
    bVar1 = *pbVar12;
    iVar10 = iVar10 + ((bVar1 & 0x7f) << (bVar7 & 0x1f));
    bVar7 = bVar7 + 7;
    pbVar12 = pbVar12 + 1;
  } while ((char)bVar1 < '\0');
  MCInst_setOpcode(MI,uVar11);
  uVar17 = 2;
  uVar16 = 2;
  if (0x23 < iVar10 - 1U) goto LAB_001bf66c;
  pvVar8 = (void *)((long)&switchD_001beeb8::switchdataD_0024f358 +
                   (long)(int)(&switchD_001beeb8::switchdataD_0024f358)[iVar10 - 1U]);
  uVar14 = (uint)uVar18;
  uVar11 = (uint)uVar18;
  switch(iVar10) {
  case 1:
    DVar4 = DecodeGRRegsRegisterClass(MI,uVar19 & 0xf,(uint64_t)info,pvVar8);
    break;
  case 2:
    DVar4 = Decode2RInstruction(MI,(uint)uVar18,(uint64_t)info,pvVar8);
    break;
  case 3:
    DVar4 = Decode2RUSInstruction(MI,(uint)uVar18,(uint64_t)info,pvVar8);
    break;
  case 4:
    DVar4 = DecodeR2RInstruction(MI,(uint)uVar18,(uint64_t)info,pvVar8);
    break;
  case 5:
    DVar4 = Decode3RInstruction(MI,(uint)uVar18,(uint64_t)info,pvVar8);
    break;
  case 6:
    DVar4 = Decode2RImmInstruction(MI,(uint)uVar18,(uint64_t)info,pvVar8);
    break;
  case 7:
    DVar4 = Decode2RSrcDstInstruction(MI,(uint)uVar18,(uint64_t)info,pvVar8);
    break;
  case 8:
    DVar4 = DecodeRUSSrcDstBitpInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 9:
    DVar4 = DecodeRUSInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 10:
    DVar4 = DecodeRRegsRegisterClass(MI,uVar18 >> 6 & 0xf,(uint64_t)info,pvVar8);
    goto LAB_001bf058;
  case 0xb:
    goto switchD_001beeb8_caseD_b;
  case 0xc:
    DVar4 = DecodeGRRegsRegisterClass(MI,uVar18 >> 6 & 0xf,(uint64_t)info,pvVar8);
LAB_001bf058:
    if (DVar4 != MCDisassembler_Fail) {
      uVar5 = (ulong)(uVar11 & 0x3f);
LAB_001bf393:
      uVar16 = 2;
      goto LAB_001bf661;
    }
    goto switchD_001bed09_default;
  case 0xd:
    goto switchD_001beeb8_caseD_d;
  case 0xe:
    DVar4 = DecodeGRRegsRegisterClass(MI,uVar18 >> 6 & 0xf,(uint64_t)info,pvVar8);
    if (DVar4 != MCDisassembler_Fail) {
      uVar5 = (ulong)(uVar11 & 0x3f);
      goto LAB_001bf0e0;
    }
    goto switchD_001bed09_default;
  case 0xf:
    DVar4 = DecodeRUSBitpInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x10:
    DVar4 = Decode2RUSBitpInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x11:
    DVar4 = Decode3RImmInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x12:
    goto switchD_001beeb8_caseD_12;
  case 0x13:
    goto switchD_001beeb8_caseD_13;
  case 0x14:
    DVar4 = DecodeL2RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x15:
    DVar4 = DecodeL3RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x16:
    DVar4 = DecodeL4RSrcDstInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x17:
    DVar4 = DecodeL4RSrcDstSrcDstInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x18:
    DVar4 = DecodeL5RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x19:
    DVar4 = DecodeL6RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x1a:
    DVar4 = DecodeLR2RInstruction(MI,uVar14,(uint64_t)info,pvVar8);
    break;
  case 0x1b:
    uVar19 = 0;
    goto LAB_001bf377;
  case 0x1c:
    uVar18 = uVar18 << 6;
    goto LAB_001beee6;
  case 0x1d:
    uVar19 = 1;
LAB_001bf377:
    pMVar6 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,uVar19);
    MCOperand_CreateReg0(MI,(uint)*pMVar6->RegsBegin);
    uVar5 = ((ulong)uVar18 & 0x3ff) << 6;
    goto LAB_001bf393;
  case 0x1e:
    uVar19 = uVar14 << 6;
    goto LAB_001bf367;
  case 0x1f:
    pMVar6 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,1);
    MCOperand_CreateReg0(MI,(uint)*pMVar6->RegsBegin);
    uVar5 = ((ulong)uVar18 & 0x3ff) << 6;
LAB_001bf0e0:
    uVar5 = -uVar5;
    goto LAB_001bf393;
  case 0x20:
    DVar4 = DecodeL2RUSBitpInstruction(MI,uVar14,(uint64_t)info,pvVar8);
    break;
  case 0x21:
    DVar4 = DecodeL2RUSInstruction(MI,uVar14,(uint64_t)info,pvVar8);
    break;
  case 0x22:
    DVar4 = DecodeL3RSrcDstInstruction(MI,uVar14,(uint64_t)info,pvVar8);
    break;
  case 0x23:
    uVar18 = uVar18 << 10;
LAB_001beee6:
    uVar5 = (ulong)uVar18;
    uVar16 = uVar17;
    goto LAB_001bf661;
  case 0x24:
    uVar19 = uVar19 << 10;
LAB_001bf367:
    uVar5 = (ulong)(uVar19 & 0xffff);
    goto LAB_001bf65e;
  }
  if (DVar4 == MCDisassembler_Fail) {
switchD_001bed09_default:
    uVar11 = 0;
    if (3 < code_len) {
      uVar19 = *(uint *)code;
      puVar3 = DecoderTable32;
      do {
        puVar13 = puVar3;
        switch(*puVar13) {
        case '\x01':
          uVar11 = ~(-1 << (puVar13[2] & 0x1f)) << (puVar13[1] & 0x1f);
          if (puVar13[2] == 0x20) {
            uVar11 = 0xffffffff;
          }
          uVar11 = (uVar11 & uVar19) >> (puVar13[1] & 0x1f);
          puVar3 = puVar13 + 3;
          break;
        case '\x02':
          uVar5 = 0;
          uVar14 = 0;
          bVar7 = 0;
          do {
            lVar2 = uVar5 + 1;
            uVar14 = uVar14 + ((puVar13[lVar2] & 0x7f) << (bVar7 & 0x1f));
            bVar7 = bVar7 + 7;
            uVar5 = uVar5 + 1;
          } while ((char)puVar13[lVar2] < '\0');
          puVar3 = puVar13 + (uVar5 & 0xffffffff) + 3;
          if (uVar11 != uVar14) {
            puVar3 = puVar13 + (uVar5 & 0xffffffff) + 3 +
                     *(ushort *)(puVar13 + (uVar5 & 0xffffffff) + 1);
          }
          break;
        case '\x03':
          uVar14 = ~(-1 << (puVar13[2] & 0x1f)) << (puVar13[1] & 0x1f);
          if (puVar13[2] == 0x20) {
            uVar14 = 0xffffffff;
          }
          uVar5 = 0;
          uVar15 = 0;
          bVar7 = 0;
          do {
            lVar2 = uVar5 + 3;
            uVar15 = uVar15 + ((puVar13[lVar2] & 0x7f) << (bVar7 & 0x1f));
            bVar7 = bVar7 + 7;
            uVar5 = uVar5 + 1;
          } while ((char)puVar13[lVar2] < '\0');
          puVar3 = puVar13 + (uVar5 & 0xffffffff) + 5;
          if ((uVar14 & uVar19) >> (puVar13[1] & 0x1f) != uVar15) {
            puVar3 = puVar13 + (uVar5 & 0xffffffff) + 5 +
                     *(ushort *)(puVar13 + (uVar5 & 0xffffffff) + 3);
          }
          break;
        case '\x04':
          uVar5 = 0;
          do {
            lVar2 = uVar5 + 1;
            uVar5 = uVar5 + 1;
          } while ((char)puVar13[lVar2] < '\0');
          puVar3 = puVar13 + (uVar5 & 0xffffffff) + 3;
          break;
        case '\x05':
          goto switchD_001bf170_caseD_5;
        case '\x06':
          uVar5 = 0;
          do {
            lVar2 = uVar5 + 1;
            uVar5 = uVar5 + 1;
          } while ((char)puVar13[lVar2] < '\0');
          uVar9 = 0;
          do {
            lVar2 = uVar9 + (uVar5 & 0xffffffff) + 1;
            uVar9 = uVar9 + 1;
          } while ((char)puVar13[lVar2] < '\0');
          puVar3 = puVar13 + (uVar9 & 0xffffffff) + (uVar5 & 0xffffffff) + 1;
          break;
        default:
          goto switchD_001bf170_default;
        }
      } while( true );
    }
    goto LAB_001bf676;
  }
  goto LAB_001bf66c;
switchD_001bf170_caseD_5:
  uVar5 = 0;
  uVar11 = 0;
  bVar7 = 0;
  do {
    lVar2 = uVar5 + 1;
    uVar11 = uVar11 + ((puVar13[lVar2] & 0x7f) << (bVar7 & 0x1f));
    bVar7 = bVar7 + 7;
    uVar5 = uVar5 + 1;
  } while ((char)puVar13[lVar2] < '\0');
  pbVar12 = puVar13 + (uVar5 & 0xffffffff) + 1;
  iVar10 = 0;
  bVar7 = 0;
  do {
    bVar1 = *pbVar12;
    iVar10 = iVar10 + ((bVar1 & 0x7f) << (bVar7 & 0x1f));
    bVar7 = bVar7 + 7;
    pbVar12 = pbVar12 + 1;
  } while ((char)bVar1 < '\0');
  MCInst_setOpcode(MI,uVar11);
  uVar17 = 4;
  uVar16 = 4;
  if (0x23 < iVar10 - 1U) goto LAB_001bf66c;
  pvVar8 = (void *)((long)&switchD_001bf312::switchdataD_0024f400 +
                   (long)(int)(&switchD_001bf312::switchdataD_0024f400)[iVar10 - 1U]);
  switch(iVar10) {
  case 1:
    DVar4 = DecodeGRRegsRegisterClass(MI,uVar19 & 0xf,(uint64_t)info,pvVar8);
    break;
  case 2:
    DVar4 = Decode2RInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 3:
    DVar4 = Decode2RUSInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 4:
    DVar4 = DecodeR2RInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 5:
    DVar4 = Decode3RInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 6:
    DVar4 = Decode2RImmInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 7:
    DVar4 = Decode2RSrcDstInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 8:
    DVar4 = DecodeRUSSrcDstBitpInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 9:
    DVar4 = DecodeRUSInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 10:
    DVar4 = DecodeRRegsRegisterClass(MI,uVar19 >> 6 & 0xf,(uint64_t)info,pvVar8);
    goto LAB_001bf46b;
  case 0xb:
switchD_001beeb8_caseD_b:
    uVar5 = (ulong)(uVar19 & 0x3f);
    uVar16 = uVar17;
    goto LAB_001bf661;
  case 0xc:
    DVar4 = DecodeGRRegsRegisterClass(MI,uVar19 >> 6 & 0xf,(uint64_t)info,pvVar8);
LAB_001bf46b:
    if (DVar4 != MCDisassembler_Fail) {
      uVar5 = (ulong)(uVar19 & 0x3f);
LAB_001bf6b3:
      uVar16 = 4;
      goto LAB_001bf661;
    }
    goto switchD_001bf170_default;
  case 0xd:
switchD_001beeb8_caseD_d:
    uVar5 = (ulong)(uVar19 & 0x3f);
    goto LAB_001bf65e;
  case 0xe:
    DVar4 = DecodeGRRegsRegisterClass(MI,uVar19 >> 6 & 0xf,(uint64_t)info,pvVar8);
    if (DVar4 == MCDisassembler_Fail) goto switchD_001bf170_default;
    uVar19 = uVar19 & 0x3f;
LAB_001bf5dc:
    uVar5 = -(ulong)uVar19;
    goto LAB_001bf6b3;
  case 0xf:
    DVar4 = DecodeRUSBitpInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 0x10:
    DVar4 = Decode2RUSBitpInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 0x11:
    DVar4 = Decode3RImmInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 0x12:
switchD_001beeb8_caseD_12:
    uVar5 = (ulong)(uVar19 & 0x3ff);
    uVar16 = uVar17;
    goto LAB_001bf661;
  case 0x13:
switchD_001beeb8_caseD_13:
    uVar5 = (ulong)(uVar19 & 0x3ff);
    goto LAB_001bf65e;
  case 0x14:
    DVar4 = DecodeL2RInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 0x15:
    DVar4 = DecodeL3RInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 0x16:
    DVar4 = DecodeL4RSrcDstInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 0x17:
    DVar4 = DecodeL4RSrcDstSrcDstInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 0x18:
    DVar4 = DecodeL5RInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 0x19:
    DVar4 = DecodeL6RInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 0x1a:
    DVar4 = DecodeLR2RInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 0x1b:
    DVar4 = DecodeRRegsRegisterClass(MI,uVar19 >> 0x16 & 0xf,(uint64_t)info,pvVar8);
    goto LAB_001bf69b;
  case 0x1c:
    uVar11 = (uVar19 & 0x3ff) << 6;
    uVar19 = uVar19 >> 0x10 & 0x3f;
    goto LAB_001bf3e1;
  case 0x1d:
    DVar4 = DecodeGRRegsRegisterClass(MI,uVar19 >> 0x16 & 0xf,(uint64_t)info,pvVar8);
LAB_001bf69b:
    if (DVar4 != MCDisassembler_Fail) {
      uVar5 = (ulong)(uVar19 >> 0x10 & 0x3f | (uVar19 & 0x3ff) << 6);
      goto LAB_001bf6b3;
    }
    goto switchD_001bf170_default;
  case 0x1e:
    uVar11 = (uVar19 & 0x3ff) << 6;
    uVar19 = uVar19 >> 0x10 & 0x3f;
    goto LAB_001bf65b;
  case 0x1f:
    DVar4 = DecodeGRRegsRegisterClass(MI,uVar19 >> 0x16 & 0xf,(uint64_t)info,pvVar8);
    if (DVar4 != MCDisassembler_Fail) {
      uVar19 = uVar19 >> 0x10 & 0x3f | (uVar19 & 0x3ff) << 6;
      goto LAB_001bf5dc;
    }
    goto switchD_001bf170_default;
  case 0x20:
    DVar4 = DecodeL2RUSBitpInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 0x21:
    DVar4 = DecodeL2RUSInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 0x22:
    DVar4 = DecodeL3RSrcDstInstruction(MI,uVar19,(uint64_t)info,pvVar8);
    break;
  case 0x23:
    uVar11 = (uVar19 & 0x3ff) << 10;
    uVar19 = uVar19 >> 0x10 & 0x3ff;
LAB_001bf3e1:
    uVar5 = (ulong)(uVar19 | uVar11);
    uVar16 = uVar17;
    goto LAB_001bf661;
  case 0x24:
    uVar11 = (uVar19 & 0x3ff) << 10;
    uVar19 = uVar19 >> 0x10 & 0x3ff;
LAB_001bf65b:
    uVar5 = (ulong)(uVar19 | uVar11);
LAB_001bf65e:
    uVar5 = -uVar5;
    uVar16 = uVar17;
LAB_001bf661:
    MCOperand_CreateImm0(MI,uVar5);
    goto LAB_001bf66c;
  }
  if (DVar4 == MCDisassembler_Fail) {
switchD_001bf170_default:
    uVar11 = 0;
  }
  else {
LAB_001bf66c:
    *size = uVar16;
    uVar11 = 1;
  }
LAB_001bf676:
  return SUB41(uVar11,0);
}

Assistant:

static bool readInstruction16(const uint8_t *code, size_t code_len, uint16_t *insn)
{
	if (code_len < 2)
		// insufficient data
		return false;

	// Encoded as a little-endian 16-bit word in the stream.
	*insn = (code[0] <<  0) | (code[1] <<  8);
	return true;
}